

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O3

void __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest::prepareVertexBuffersData
          (GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest *this,
          vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
          *vertex_buffer_infos)

{
  pointer *ppVVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  int iVar4;
  uint uVar5;
  uint i;
  long lVar6;
  VertexBufferInfo info;
  VertexBufferInfo local_50;
  
  iVar2 = (this->super_GPUShader5TextureGatherOffsetDepthTestBase).
          super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  iVar3 = (this->super_GPUShader5TextureGatherOffsetDepthTestBase).
          super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  std::vector<int,_std::allocator<int>_>::resize(&this->m_offsets_buffer_data,0x100);
  lVar6 = 0;
  do {
    iVar4 = rand();
    local_50.data =
         (this->m_offsets_buffer_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(int *)((long)local_50.data + lVar6 * 4) = iVar4 % ((iVar3 - iVar2) + 1) + iVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  local_50.attribute_name = "offsets";
  local_50.n_components = 2;
  local_50.type = 0x1404;
  uVar5 = *(int *)&(this->m_offsets_buffer_data).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (int)local_50.data;
  local_50.data_size = uVar5 & 0xfffffffc;
  __position._M_current =
       (vertex_buffer_infos->
       super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (vertex_buffer_infos->
      super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>>
    ::_M_realloc_insert<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo_const&>
              ((vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>>
                *)vertex_buffer_infos,__position,&local_50);
  }
  else {
    (__position._M_current)->data = local_50.data;
    *(ulong *)&(__position._M_current)->data_size =
         CONCAT44(local_50._28_4_,uVar5) & 0xfffffffffffffffc;
    (__position._M_current)->attribute_name = "offsets";
    (__position._M_current)->n_components = 2;
    (__position._M_current)->type = 0x1404;
    ppVVar1 = &(vertex_buffer_infos->
               super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest::prepareVertexBuffersData(
	std::vector<VertexBufferInfo>& vertex_buffer_infos)
{
	/* Constants for offsets and size of buffer */
	const unsigned int n_total_components = m_n_vertices * m_n_offsets_components;

	/* Limits used to generate offsets */
	const glw::GLint min_ptgo = m_min_texture_gather_offset;
	const glw::GLint max_ptgo = m_max_texture_gather_offset;

	/* Storage for offsets */
	m_offsets_buffer_data.resize(n_total_components);

	/* Generate offsets */
	for (unsigned int i = 0; i < n_total_components; ++i)
	{
		m_offsets_buffer_data[i] = (rand() % (max_ptgo - min_ptgo + 1)) + min_ptgo;
	}

	/* Setup offsets VB info */
	VertexBufferInfo info;

	info.attribute_name = m_offsets_attribute_name;
	info.n_components   = m_n_offsets_components;
	info.type			= GL_INT;
	info.data			= &m_offsets_buffer_data[0];
	info.data_size		= (glw::GLuint)(m_offsets_buffer_data.size() * sizeof(glw::GLint));

	/* Add VB info to vector */
	vertex_buffer_infos.push_back(info);
}